

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  uint uVar9;
  int iVar10;
  RegularExpression *rx;
  pointer pRVar11;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1d8 [7];
  char local_1d1;
  long *local_1d0;
  long local_1c0 [2];
  pointer local_1b0;
  undefined1 local_1a8 [376];
  
  uVar6 = 0;
  if (this->UseCTestLaunch == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Line: [",7);
    if (data == (char *)0x0) {
      std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
    }
    else {
      sVar7 = strlen(data);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x440,(char *)local_1d0,(this->super_cmCTestGenericHandler).Quiet);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_1d1 = true;
    if (this->ErrorQuotaReached == false) {
      pRVar11 = (this->ErrorMatchRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (this->ErrorMatchRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = false;
      if (pRVar11 != local_1b0) {
        iVar10 = 0;
        do {
          bVar4 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Error Line: ",0xe);
            if (data == (char *)0x0) {
              std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x30);
            }
            else {
              sVar7 = strlen(data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," (matches: ",0xb);
            pbVar2 = (this->CustomErrorMatches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,pbVar2[iVar10]._M_dataplus._M_p,
                                pbVar2[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x451,(char *)local_1d0,(this->super_cmCTestGenericHandler).Quiet);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar5 = true;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar4 && pRVar11 != local_1b0);
      }
      pRVar11 = (this->ErrorExceptionRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (this->ErrorExceptionRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar11 != local_1b0) {
        iVar10 = 0;
        do {
          bVar4 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Not an error Line: ",0x15);
            if (data == (char *)0x0) {
              std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x30);
            }
            else {
              sVar7 = strlen(data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," (matches: ",0xb);
            pbVar2 = (this->CustomErrorExceptions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,pbVar2[iVar10]._M_dataplus._M_p,
                                pbVar2[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x460,(char *)local_1d0,(this->super_cmCTestGenericHandler).Quiet);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar5 = false;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar4 && pRVar11 != local_1b0);
      }
      local_1d1 = !bVar5;
    }
    uVar9 = 0;
    if (this->WarningQuotaReached == false) {
      pRVar11 = (this->WarningMatchRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (this->WarningMatchRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = 0;
      if (pRVar11 != local_1b0) {
        iVar10 = 0;
        do {
          bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
          if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Warning Line: ",0x10);
            if (data == (char *)0x0) {
              std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x30);
            }
            else {
              sVar7 = strlen(data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," (matches: ",0xb);
            pbVar2 = (this->CustomWarningMatches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,pbVar2[iVar10]._M_dataplus._M_p,
                                pbVar2[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x471,(char *)local_1d0,(this->super_cmCTestGenericHandler).Quiet);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar3 = 1;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar5 && pRVar11 != local_1b0);
      }
      pRVar11 = (this->WarningExceptionRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (this->WarningExceptionRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar11 != local_1b0) {
        iVar10 = 0;
        do {
          bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
          if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Not a warning Line: ",0x16);
            if (data == (char *)0x0) {
              std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x30);
            }
            else {
              sVar7 = strlen(data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," (matches: ",0xb);
            pbVar2 = (this->CustomWarningExceptions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,pbVar2[iVar10]._M_dataplus._M_p,
                                pbVar2[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x481,(char *)local_1d0,(this->super_cmCTestGenericHandler).Quiet);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar3 = 0;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar5 && pRVar11 != local_1b0);
      }
      uVar9 = (uint)bVar3;
    }
    uVar6 = 2;
    if (local_1d1 != '\0') {
      uVar6 = uVar9;
    }
  }
  return uVar6;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << data << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(data)) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << data << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(data)) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << data << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(data)) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(data)) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}